

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O3

int Sto_ManMemoryReport(Sto_Man_t *p)

{
  int iVar1;
  long *plVar2;
  
  if ((long *)p->pChunkLast != (long *)0x0) {
    iVar1 = p->nChunkUsed;
    plVar2 = *(long **)p->pChunkLast;
    if (plVar2 != (long *)0x0) {
      do {
        iVar1 = iVar1 + p->nChunkSize;
        plVar2 = (long *)*plVar2;
      } while (plVar2 != (long *)0x0);
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int Sto_ManMemoryReport( Sto_Man_t * p )
{
    int Total;
    char * pMem, * pNext;
    if ( p->pChunkLast == NULL )
        return 0;
    Total = p->nChunkUsed; 
    for ( pMem = p->pChunkLast; (pNext = *(char **)pMem); pMem = pNext )
        Total += p->nChunkSize;
    return Total;
}